

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_pack_hdu(fitsfile *infptr,fitsfile *outfptr,fpstate fpvar,int *islossless,int *status)

{
  int iVar1;
  int *in_RCX;
  undefined4 *in_RDX;
  fitsfile *in_RSI;
  fitsfile *in_RDI;
  imgstats imagestats;
  double noisemin;
  long datasize;
  long dataend;
  long datastart;
  long headstart;
  char fzalgor [71];
  char outfits [513];
  double rescale;
  double bscale;
  int hdunum;
  int tstatus;
  int bitpix;
  int hdutype;
  int ii;
  int naxis;
  int totpix;
  int stat;
  long naxes [9];
  fitsfile *tempfile;
  int *in_stack_0000ab88;
  fitsfile *in_stack_0000ab90;
  fitsfile *in_stack_0000ab98;
  fitsfile *in_stack_fffffffffffffc78;
  fitsfile *fptr;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  fitsfile *in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  fitsfile *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  fitsfile *in_stack_fffffffffffffcb8;
  fitsfile *local_340;
  fitsfile *local_338;
  fitsfile *pfVar2;
  fitsfile *in_stack_fffffffffffffcd8;
  double in_stack_fffffffffffffce0;
  long *in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcf4;
  fitsfile *in_stack_fffffffffffffcf8;
  fitsfile *in_stack_fffffffffffffd00;
  fitsfile *in_stack_fffffffffffffd08;
  int *in_stack_fffffffffffffd80;
  fitsfile *in_stack_fffffffffffffd88;
  int *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe40;
  fitsfile *in_stack_fffffffffffffe48;
  imgstats *in_stack_fffffffffffffe50;
  imgstats *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  fitsfile *in_stack_fffffffffffffe70;
  double local_a0;
  uint local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined8 local_78 [10];
  int *local_28;
  undefined4 *local_20;
  fitsfile *local_18;
  fitsfile *local_10;
  
  fptr = (fitsfile *)&stack0x00000008;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(local_78,&DAT_0026dcf0,0x48);
  local_7c = 0;
  local_80 = 0;
  local_84 = 0;
  if (*local_28 == 0) {
    ffghdt((fitsfile *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
           &fptr->HDUposition,&in_stack_fffffffffffffc78->HDUposition);
    if (local_8c == 0) {
      ffgipr(in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
             (int *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),&fptr->HDUposition
             ,(long *)in_stack_fffffffffffffc78,(int *)0x10ade8);
      local_80 = 1;
      for (local_88 = 0; local_88 < 9; local_88 = local_88 + 1) {
        local_80 = local_80 * (int)local_78[local_88];
      }
    }
    local_94 = 0;
    iVar1 = ffgky(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,
                  (char *)in_stack_fffffffffffffca8,
                  (void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                  (char *)in_stack_fffffffffffffc98,
                  (int *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    if ((iVar1 == 0) &&
       ((iVar1 = strcmp(&stack0xfffffffffffffcf8,"NONE"), iVar1 == 0 ||
        (iVar1 = strcmp(&stack0xfffffffffffffcf8,"none"), iVar1 == 0)))) {
      ffcopy(in_stack_fffffffffffffc98,
             (fitsfile *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc8c,&fptr->HDUposition);
      *local_28 = local_7c;
    }
    else if ((local_8c == 2) && (fptr[8].HDUposition != 0)) {
      ffghad(in_stack_fffffffffffffca8,
             (long *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
             (long *)in_stack_fffffffffffffc98,
             (long *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (int *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if ((long)in_stack_fffffffffffffce0 - (long)in_stack_fffffffffffffce8 < 0xb41) {
        ffcopy(in_stack_fffffffffffffc98,
               (fitsfile *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc8c,&fptr->HDUposition);
      }
      else {
        fits_compress_table(in_stack_0000ab98,in_stack_0000ab90,in_stack_0000ab88);
      }
      *local_28 = local_7c;
    }
    else {
      iVar1 = fits_is_compressed_image(in_stack_fffffffffffffc78,(int *)0x10afc4);
      if ((((iVar1 == 0) && (local_8c == 0)) && (local_84 != 0)) &&
         ((local_80 != 0 && (*(int *)((long)&fptr[7].Fptr + 4) != 0)))) {
        if (((*(float *)&fptr[1].Fptr != 0.0) || (NAN(*(float *)&fptr[1].Fptr))) &&
           ((0 < local_90 && (local_90 < 0x40)))) {
          local_94 = 0;
          ffgky(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb4,
                (char *)in_stack_fffffffffffffca8,
                (void *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                (char *)in_stack_fffffffffffffc98,
                (int *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
          if ((local_94 == 0) && ((local_a0 != 1.0 || (NAN(local_a0))))) {
            if (local_90 == 0x20) {
              fp_i4stat((fitsfile *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                        in_stack_fffffffffffffe64,(long *)in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->HDUposition);
            }
            else {
              fp_i2stat(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                        (long *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58,&in_stack_fffffffffffffe50->n_nulls);
            }
            pfVar2 = local_340;
            if ((((double)in_stack_fffffffffffffcb8 != 0.0) ||
                (NAN((double)in_stack_fffffffffffffcb8))) &&
               ((double)in_stack_fffffffffffffcb8 < (double)local_340)) {
              pfVar2 = in_stack_fffffffffffffcb8;
            }
            if ((((double)local_338 != 0.0) || (NAN((double)local_338))) &&
               ((double)local_338 < (double)pfVar2)) {
              pfVar2 = local_338;
            }
            if (1.0 < (double)pfVar2 / (double)*(float *)&fptr[1].Fptr) {
              ffflnm(fptr,(char *)in_stack_fffffffffffffc78,(int *)0x10b1da);
              fp_tmpnam((char *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                        (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                        (char *)fptr);
              ffinit((fitsfile **)fpvar.prefix._284_8_,(char *)fpvar.prefix._276_8_,
                     (int *)fpvar.prefix._268_8_);
              ffghdn(local_10,(int *)&local_98);
              if (local_98 != 1) {
                ffcrim(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,in_stack_fffffffffffffca0
                       ,(long *)in_stack_fffffffffffffc98,
                       (int *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
              }
              ffcphd(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                     &in_stack_fffffffffffffcf8->HDUposition);
              if (local_90 == 0x20) {
                fp_i4rescale(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
                             in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                             in_stack_fffffffffffffcd8,&pfVar2->HDUposition);
              }
              else {
                fp_i2rescale(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4,
                             in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                             in_stack_fffffffffffffcd8,&pfVar2->HDUposition);
              }
              ffuky(in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,
                    (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),fptr,
                    (char *)in_stack_fffffffffffffc78,(int *)0x10b330);
              ffrdef(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
              fits_img_compress(in_stack_fffffffffffffcb8,
                                (fitsfile *)
                                CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                                &in_stack_fffffffffffffca8->HDUposition);
              ffdelt(in_stack_fffffffffffffca8,
                     (int *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
              tempfilename3[0] = '\0';
              *local_20 = 0;
              *local_28 = local_7c;
              return 0;
            }
          }
        }
        if ((0 < local_90) && (fptr[2].HDUposition != 0)) {
          if (local_90 < 0x20) {
            fp_i2stat(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                      (long *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                      in_stack_fffffffffffffe58,&in_stack_fffffffffffffe50->n_nulls);
          }
          else {
            fp_i4stat((fitsfile *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                      in_stack_fffffffffffffe64,(long *)in_stack_fffffffffffffe58,
                      in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->HDUposition);
          }
          ffrhdu(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          pfVar2 = local_340;
          if ((((double)in_stack_fffffffffffffcb8 != 0.0) ||
              (NAN((double)in_stack_fffffffffffffcb8))) &&
             ((double)in_stack_fffffffffffffcb8 < (double)local_340)) {
            pfVar2 = in_stack_fffffffffffffcb8;
          }
          if ((((double)local_338 != 0.0) || (NAN((double)local_338))) &&
             ((double)local_338 < (double)pfVar2)) {
            pfVar2 = local_338;
          }
          if (((double)pfVar2 < (double)(*(float *)&fptr[2].field_0x4 * *(float *)&fptr->field_0x4))
             || ((double)local_340 < (double)*(float *)&fptr[2].Fptr)) {
            fits_set_lossy_int(local_18,0,&local_7c);
            ffghdn(local_10,(int *)&local_98);
            printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n"
                   ,(ulong)local_98);
          }
          else {
            *local_20 = 0;
          }
        }
        fits_img_compress(in_stack_fffffffffffffcb8,
                          (fitsfile *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                          &in_stack_fffffffffffffca8->HDUposition);
        if ((local_90 < 0) ||
           ((fptr->HDUposition == 0x29 &&
            ((*(float *)&fptr[1].field_0x4 != 0.0 || (NAN(*(float *)&fptr[1].field_0x4))))))) {
          *local_20 = 0;
        }
      }
      else {
        ffcopy(in_stack_fffffffffffffc98,
               (fitsfile *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               in_stack_fffffffffffffc8c,&fptr->HDUposition);
      }
      *local_28 = local_7c;
    }
  }
  return 0;
}

Assistant:

int fp_pack_hdu (fitsfile *infptr, fitsfile *outfptr, fpstate fpvar,
   int *islossless, int *status)
{
	fitsfile *tempfile;
	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	int	stat=0, totpix=0, naxis=0, ii, hdutype, bitpix;
	int	tstatus, hdunum;
	double  bscale, rescale;

	char	outfits[SZ_STR], fzalgor[FLEN_VALUE];
	long 	headstart, datastart, dataend, datasize;
	double  noisemin;
	/* structure to hold image statistics (defined in fpack.h) */
	imgstats imagestats;

	if (*status) return(0);

	fits_get_hdu_type (infptr, &hdutype, &stat);

	if (hdutype == IMAGE_HDU) {
	    fits_get_img_param (infptr, 9, &bitpix, &naxis, naxes, &stat);
	    for (totpix=1, ii=0; ii < 9; ii++) totpix *= naxes[ii];
	}

	/* check directive keyword to see if this HDU should not be compressed */
        tstatus = 0;
        if (!fits_read_key(infptr, TSTRING, "FZALGOR", fzalgor, NULL, &tstatus) ) {
	    if (!strcmp(fzalgor, "NONE") || !strcmp(fzalgor, "none") ) {
 	        fits_copy_hdu (infptr, outfptr, 0, &stat);

	        *status = stat;
	        return(0);
            }
	}

        /* =============================================================== */
        /* This block is only for  binary table compression */
	if (hdutype == BINARY_TBL && fpvar.do_tables) { 

	    fits_get_hduaddr(infptr, &headstart, &datastart, &dataend, status); 
	    datasize = dataend - datastart;

	    if (datasize <= 2880) {
		/* data is less than 1 FITS block in size, so don't compress */
	        fits_copy_hdu (infptr, outfptr, 0, &stat);
	    } else {
		    fits_compress_table (infptr, outfptr, &stat);
	    }

	    *status = stat;
	    return(0);
	}
        /* =============================================================== */

        /* If this is not a non-null image HDU, just copy it verbatim */
	if (fits_is_compressed_image (infptr,  &stat) || hdutype != IMAGE_HDU ||
	    naxis == 0 || totpix == 0 || !fpvar.do_images) {
	        fits_copy_hdu (infptr, outfptr, 0, &stat);

	} else {  /* remaining code deals only with IMAGE HDUs */

		/* special case: rescale a scaled integer image to reduce noise? */
		if (fpvar.rescale_noise != 0. && bitpix > 0 && bitpix < LONGLONG_IMG) {

		   tstatus = 0;
		   fits_read_key(infptr, TDOUBLE, "BSCALE", &bscale, 0, &tstatus);
		   if (tstatus == 0 && bscale != 1.0) {  /* image must be scaled */

			if (bitpix == LONG_IMG)
			  fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			rescale = noisemin / fpvar.rescale_noise;
			if (rescale > 1.0) {
			  
			  /* all the criteria are met, so create a temporary file that */
			  /* contains a rescaled version of the image, in output directory */
			  
			  /* create temporary file name */
			  fits_file_name(outfptr, outfits, &stat);  /* get the output file name */
			  fp_tmpnam("Tmp3", outfits, tempfilename3);

			  fits_create_file(&tempfile, tempfilename3, &stat);

			  fits_get_hdu_num(infptr, &hdunum);
			  if (hdunum != 1) {

			     /* the input hdu is an image extension, so create dummy primary */
			     fits_create_img(tempfile, 8, 0, naxes, &stat);
			  }

			  fits_copy_header(infptr, tempfile, &stat); /* copy the header */
			  
			  /* rescale the data, so that it will compress more efficiently */
			  if (bitpix == LONG_IMG)
			    fp_i4rescale(infptr, naxis, naxes, rescale, tempfile, &stat);
			  else
			    fp_i2rescale(infptr, naxis, naxes, rescale, tempfile, &stat);


			  /* scale the BSCALE keyword by the inverse factor */

			  bscale = bscale * rescale;  
			  fits_update_key(tempfile, TDOUBLE, "BSCALE", &bscale, 0, &stat);

			  /* rescan the header, to reset the actual scaling parameters */
			  fits_set_hdustruc(tempfile, &stat);

		          fits_img_compress (tempfile, outfptr, &stat);
		          fits_delete_file  (tempfile, &stat);
		          tempfilename3[0] = '\0';   /* clear the temp filename */
		          *islossless = 0;  /* used a lossy compression method */

	                  *status = stat;
	                  return(0);
			}
		   }
		}

		/* if requested to do lossy compression of integer images (by */
		/* converting to float), then check if this HDU qualifies */
		if ( (bitpix > 0) && (fpvar.int_to_float != 0) ) {
		    
			if (bitpix >= LONG_IMG)
			  fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);

			/* rescan the image header to reset scaling values (changed by fp_iNstat) */
			ffrhdu(infptr, &hdutype, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			if ( (noisemin < (fpvar.n3ratio * fpvar.quantize_level) ) ||
			    (imagestats.noise3 < fpvar.n3min)) {
			
			    /* image contains too little noise to quantize effectively */
			    fits_set_lossy_int (outfptr, 0, &stat);

			    fits_get_hdu_num(infptr, &hdunum);

printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n", hdunum);

			} else {
			    /* compressed image is not identical to original */
			    *islossless = 0;
			}  
		}

                /* finally, do the actual image compression */
		fits_img_compress (infptr, outfptr, &stat);

		if (bitpix < 0 || 
		    (fpvar.comptype == HCOMPRESS_1 && fpvar.scale != 0.)) {

		    /* compressed image is not identical to original */
		    *islossless = 0;  
		}
	}

	*status = stat;
	return(0);
}